

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
test<mpl_::bool_<false>>(void *param_1,char param_2,undefined8 param_3)

{
  byte bVar1;
  bool bVar2;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *unaff_retaddr;
  char_type cStack000000000000000f;
  undefined8 in_stack_00000008;
  compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_stack_00000010;
  bool local_31;
  bool local_22;
  
  cStack000000000000000f = (char_type)((ulong)in_stack_00000008 >> 0x38);
  bVar1 = *(byte *)((long)param_1 + 0x20);
  bVar2 = basic_chset_8bit<char>::
          test<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                    ((basic_chset_8bit<char> *)param_1,(int)param_2,param_3);
  local_22 = true;
  if (!bVar2) {
    local_31 = false;
    if ((*(byte *)((long)param_1 + 0x21) & 1) != 0) {
      local_31 = compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 ::test_posix(in_stack_00000010,cStack000000000000000f,unaff_retaddr);
    }
    local_22 = local_31;
  }
  return (bool)(bVar1 & 1) != local_22;
}

Assistant:

bool test(char_type ch, Traits const &tr, ICase) const
    {
        return this->complement_ !=
            (this->base_type::test(ch, tr, ICase()) ||
            (this->has_posix_ && this->test_posix(ch, tr)));
    }